

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Match_Size(FT_Face face,FT_Size_Request req,FT_Bool ignore_width,FT_ULong *size_index)

{
  FT_Error FVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  FT_ULong FVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if ((face->face_flags & 2) == 0) {
    FVar1 = 0x23;
  }
  else {
    if (req->type != FT_SIZE_REQUEST_TYPE_NOMINAL) {
      return 7;
    }
    lVar10 = req->width;
    lVar2 = lVar10;
    if ((ulong)req->horiResolution != 0) {
      lVar2 = (long)((ulong)req->horiResolution * lVar10 + 0x24) / 0x48;
    }
    lVar5 = req->height;
    lVar3 = lVar5;
    if ((ulong)req->vertResolution != 0) {
      lVar3 = (long)((ulong)req->vertResolution * lVar5 + 0x24) / 0x48;
    }
    lVar4 = lVar3;
    if (lVar5 == 0) {
      lVar4 = lVar2;
    }
    lVar5 = lVar4;
    if (lVar10 == 0) {
      lVar5 = lVar3;
      lVar2 = lVar4;
    }
    FVar1 = 0x17;
    uVar8 = lVar2 + 0x20U & 0xffffffffffffffc0;
    if ((uVar8 != 0) && (uVar6 = lVar5 + 0x20U & 0xffffffffffffffc0, uVar6 != 0)) {
      FVar7 = 0;
      uVar9 = (ulong)(uint)face->num_fixed_sizes;
      if (face->num_fixed_sizes < 1) {
        uVar9 = FVar7;
      }
      lVar10 = 0x18;
      while( true ) {
        if (uVar9 == FVar7) {
          return 0x17;
        }
        if ((uVar6 == (*(long *)((long)&face->available_sizes->height + lVar10) + 0x20U &
                      0xffffffffffffffc0)) &&
           ((ignore_width != '\0' ||
            (uVar8 == (*(long *)((long)face->available_sizes + lVar10 + -8) + 0x20U &
                      0xffffffffffffffc0))))) break;
        FVar7 = FVar7 + 1;
        lVar10 = lVar10 + 0x20;
      }
      if (size_index == (FT_ULong *)0x0) {
        return 0;
      }
      *size_index = FVar7;
      return 0;
    }
  }
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Match_Size( FT_Face          face,
                 FT_Size_Request  req,
                 FT_Bool          ignore_width,
                 FT_ULong*        size_index )
  {
    FT_Int   i;
    FT_Long  w, h;


    if ( !FT_HAS_FIXED_SIZES( face ) )
      return FT_THROW( Invalid_Face_Handle );

    /* FT_Bitmap_Size doesn't provide enough info... */
    if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      return FT_THROW( Unimplemented_Feature );

    w = FT_REQUEST_WIDTH ( req );
    h = FT_REQUEST_HEIGHT( req );

    if ( req->width && !req->height )
      h = w;
    else if ( !req->width && req->height )
      w = h;

    w = FT_PIX_ROUND( w );
    h = FT_PIX_ROUND( h );

    if ( !w || !h )
      return FT_THROW( Invalid_Pixel_Size );

    for ( i = 0; i < face->num_fixed_sizes; i++ )
    {
      FT_Bitmap_Size*  bsize = face->available_sizes + i;


      if ( h != FT_PIX_ROUND( bsize->y_ppem ) )
        continue;

      if ( w == FT_PIX_ROUND( bsize->x_ppem ) || ignore_width )
      {
        FT_TRACE3(( "FT_Match_Size: bitmap strike %d matches\n", i ));

        if ( size_index )
          *size_index = (FT_ULong)i;

        return FT_Err_Ok;
      }
    }

    FT_TRACE3(( "FT_Match_Size: no matching bitmap strike\n" ));

    return FT_THROW( Invalid_Pixel_Size );
  }